

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O1

Quaternion * __thiscall AML::Quaternion::operator*=(Quaternion *this,Quaternion *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = (rhs->field_0).data[0];
  dVar2 = (rhs->field_0).data[1];
  dVar3 = (this->field_0).data[0];
  dVar4 = (this->field_0).data[1];
  dVar5 = (rhs->field_0).data[2];
  dVar6 = (rhs->field_0).data[3];
  dVar7 = (this->field_0).data[2];
  dVar8 = (this->field_0).data[3];
  (this->field_0).data[0] = ((dVar1 * dVar3 - dVar4 * dVar2) - dVar5 * dVar7) - dVar6 * dVar8;
  (this->field_0).data[1] = dVar6 * dVar7 + ((dVar1 * dVar4 + dVar3 * dVar2) - dVar5 * dVar8);
  (this->field_0).data[2] = (dVar5 * dVar3 + dVar1 * dVar7 + dVar2 * dVar8) - dVar6 * dVar4;
  (this->field_0).data[3] = dVar6 * dVar3 + dVar5 * dVar4 + (dVar1 * dVar8 - dVar7 * dVar2);
  return this;
}

Assistant:

Quaternion& Quaternion::operator*=(const Quaternion& rhs)
    {
        double q0_new = (rhs.q0 * q0) - (rhs.q1 * q1) - (rhs.q2 * q2) - (rhs.q3 * q3);
        double q1_new = (rhs.q0 * q1) + (rhs.q1 * q0) - (rhs.q2 * q3) + (rhs.q3 * q2);
        double q2_new = (rhs.q0 * q2) + (rhs.q1 * q3) + (rhs.q2 * q0) - (rhs.q3 * q1);
        double q3_new = (rhs.q0 * q3) - (rhs.q1 * q2) + (rhs.q2 * q1) + (rhs.q3 * q0);
        q0 = q0_new;
        q1 = q1_new;
        q2 = q2_new;
        q3 = q3_new;
        return *this;
    }